

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImGuiTabItem * ImGui::TabBarTabListPopupButton(ImGuiTabBar *tab_bar)

{
  float fVar1;
  float fVar2;
  ImGuiID IVar3;
  ImGuiID IVar4;
  undefined4 uVar5;
  ImGuiWindow *pIVar6;
  ImVec2 IVar7;
  undefined4 uVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  char *label;
  ImVec2 local_80;
  char *local_78;
  char *tab_name;
  ImGuiTabItem *tab;
  ImGuiTabItem *pIStack_60;
  int tab_n;
  ImGuiTabItem *tab_to_select;
  bool open;
  undefined1 local_44 [8];
  ImVec4 arrow_col;
  ImVec2 backup_cursor_pos;
  float tab_list_popup_button_width;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiTabBar *tab_bar_local;
  
  pIVar9 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  fVar1 = GImGui->FontSize;
  fVar2 = (GImGui->Style).FramePadding.y;
  IVar7 = (pIVar6->DC).CursorPos;
  ImVec2::ImVec2((ImVec2 *)&arrow_col.z,(tab_bar->BarRect).Min.x - (GImGui->Style).FramePadding.y,
                 (tab_bar->BarRect).Min.y);
  (pIVar6->DC).CursorPos.x = arrow_col.z;
  (pIVar6->DC).CursorPos.y = arrow_col.w;
  (tab_bar->BarRect).Min.x = fVar1 + fVar2 + (tab_bar->BarRect).Min.x;
  local_44._0_4_ = (pIVar9->Style).Colors[0].x;
  local_44._4_4_ = (pIVar9->Style).Colors[0].y;
  uVar5 = (pIVar9->Style).Colors[0].z;
  uVar8 = (pIVar9->Style).Colors[0].w;
  arrow_col.y = (float)uVar8 * 0.5;
  arrow_col.x = (float)uVar5;
  PushStyleColor(0,(ImVec4 *)local_44);
  ImVec4::ImVec4((ImVec4 *)((long)&tab_to_select + 4),0.0,0.0,0.0,0.0);
  PushStyleColor(0x15,(ImVec4 *)((long)&tab_to_select + 4));
  tab_to_select._3_1_ = BeginCombo("##v",(char *)0x0,0x40);
  PopStyleColor(2);
  pIStack_60 = (ImGuiTabItem *)0x0;
  if ((tab_to_select._3_1_ & 1) != 0) {
    for (tab._4_4_ = 0; tab._4_4_ < (tab_bar->Tabs).Size; tab._4_4_ = tab._4_4_ + 1) {
      tab_name = (char *)ImVector<ImGuiTabItem>::operator[](&tab_bar->Tabs,tab._4_4_);
      label = ImGuiTabBar::GetTabName(tab_bar,(ImGuiTabItem *)tab_name);
      IVar4 = tab_bar->SelectedTabId;
      IVar3 = *(ImGuiID *)tab_name;
      local_78 = label;
      ImVec2::ImVec2(&local_80,0.0,0.0);
      bVar10 = Selectable(label,IVar4 == IVar3,0,&local_80);
      if (bVar10) {
        pIStack_60 = (ImGuiTabItem *)tab_name;
      }
    }
    EndCombo();
  }
  (pIVar6->DC).CursorPos = IVar7;
  return pIStack_60;
}

Assistant:

static ImGuiTabItem* ImGui::TabBarTabListPopupButton(ImGuiTabBar* tab_bar)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // We use g.Style.FramePadding.y to match the square ArrowButton size
    const float tab_list_popup_button_width = g.FontSize + g.Style.FramePadding.y;
    const ImVec2 backup_cursor_pos = window->DC.CursorPos;
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x - g.Style.FramePadding.y, tab_bar->BarRect.Min.y);
    tab_bar->BarRect.Min.x += tab_list_popup_button_width;

    ImVec4 arrow_col = g.Style.Colors[ImGuiCol_Text];
    arrow_col.w *= 0.5f;
    PushStyleColor(ImGuiCol_Text, arrow_col);
    PushStyleColor(ImGuiCol_Button, ImVec4(0, 0, 0, 0));
    bool open = BeginCombo("##v", NULL, ImGuiComboFlags_NoPreview);
    PopStyleColor(2);

    ImGuiTabItem* tab_to_select = NULL;
    if (open)
    {
        for (int tab_n = 0; tab_n < tab_bar->Tabs.Size; tab_n++)
        {
            ImGuiTabItem* tab = &tab_bar->Tabs[tab_n];
            const char* tab_name = tab_bar->GetTabName(tab);
            if (Selectable(tab_name, tab_bar->SelectedTabId == tab->ID))
                tab_to_select = tab;
        }
        EndCombo();
    }

    window->DC.CursorPos = backup_cursor_pos;
    return tab_to_select;
}